

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

float * ma_dr_mp3_open_memory_and_read_pcm_frames_f32
                  (void *pData,size_t dataSize,ma_dr_mp3_config *pConfig,ma_uint64 *pTotalFrameCount
                  ,ma_allocation_callbacks *pAllocationCallbacks)

{
  ma_bool32 mVar1;
  float *pfVar2;
  ma_dr_mp3 mp3;
  ma_dr_mp3 local_3ef0;
  
  pfVar2 = (float *)0x0;
  memset(&local_3ef0,0,0x3ec0);
  if (dataSize != 0 && pData != (void *)0x0) {
    local_3ef0.memory.currentReadPos = 0;
    local_3ef0.memory.pData = (ma_uint8 *)pData;
    local_3ef0.memory.dataSize = dataSize;
    mVar1 = ma_dr_mp3_init_internal
                      (&local_3ef0,ma_dr_mp3__on_read_memory,ma_dr_mp3__on_seek_memory,&local_3ef0,
                       pAllocationCallbacks);
    if (mVar1 == 0) {
      pfVar2 = (float *)0x0;
    }
    else {
      pfVar2 = ma_dr_mp3__full_read_and_close_f32(&local_3ef0,pConfig,pTotalFrameCount);
    }
  }
  return pfVar2;
}

Assistant:

MA_API float* ma_dr_mp3_open_memory_and_read_pcm_frames_f32(const void* pData, size_t dataSize, ma_dr_mp3_config* pConfig, ma_uint64* pTotalFrameCount, const ma_allocation_callbacks* pAllocationCallbacks)
{
    ma_dr_mp3 mp3;
    if (!ma_dr_mp3_init_memory(&mp3, pData, dataSize, pAllocationCallbacks)) {
        return NULL;
    }
    return ma_dr_mp3__full_read_and_close_f32(&mp3, pConfig, pTotalFrameCount);
}